

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ForeachLoopListSyntax *args_2;
  LoopConstraintSyntax *pLVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::ForeachLoopListSyntax_*>::operator*
            ((not_null<slang::syntax::ForeachLoopListSyntax_*> *)0x284d03);
  args_2 = deepClone<slang::syntax::ForeachLoopListSyntax>
                     ((ForeachLoopListSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  not_null<slang::syntax::ConstraintItemSyntax_*>::operator*
            ((not_null<slang::syntax::ConstraintItemSyntax_*> *)0x284d23);
  deepClone<slang::syntax::ConstraintItemSyntax>
            ((ConstraintItemSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LoopConstraintSyntax,slang::parsing::Token,slang::syntax::ForeachLoopListSyntax&,slang::syntax::ConstraintItemSyntax&>
                     (this,(Token *)TVar2.info,TVar2._0_8_,(ConstraintItemSyntax *)args_2);
  return (int)pLVar1;
}

Assistant:

static SyntaxNode* clone(const LoopConstraintSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<LoopConstraintSyntax>(
        node.foreachKeyword.deepClone(alloc),
        *deepClone<ForeachLoopListSyntax>(*node.loopList, alloc),
        *deepClone<ConstraintItemSyntax>(*node.constraints, alloc)
    );
}